

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_debug.h
# Opt level: O2

bool immutable::validate_rrb<char,false,5>(ref<immutable::rrb<char,_false,_5>_> *rrb)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  tree_node<char,_false> *ptVar4;
  bool bVar5;
  rrb<char,_false,_5> *prVar6;
  leaf_node<char,_false> *plVar7;
  rrb<char,_false,_5> *prVar8;
  ref<immutable::rrb_details::tree_node<char,_false>_> tail;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_28;
  
  prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
  plVar7 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&prVar6->tail);
  uVar1 = plVar7->len;
  prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
  if (uVar1 != prVar6->tail_len) {
    prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
    plVar7 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&prVar6->tail);
    uVar3 = plVar7->len;
    prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
    printf("The tail of this rrb-tree says it is of length %u, but the rrb head claims it\nis %u elements long."
           ,(ulong)uVar3,(ulong)prVar6->tail_len);
    return false;
  }
  prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
  local_28.ptr = (tree_node<char,_false> *)(prVar6->tail).ptr;
  if ((leaf_node<char,_false> *)local_28.ptr != (leaf_node<char,_false> *)0x0) {
    ((leaf_node<char,_false> *)local_28.ptr)->_ref_count =
         ((leaf_node<char,_false> *)local_28.ptr)->_ref_count + 1;
  }
  prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
  bVar5 = rrb_details::validate_subtree<char,false,5>(&local_28,prVar6->tail_len,0);
  ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_28);
  if (bVar5) {
    prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
    ptVar4 = (prVar6->root).ptr;
    prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
    if (ptVar4 == (tree_node<char,_false> *)0x0) {
      uVar1 = prVar6->cnt;
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
      if (uVar1 != prVar6->tail_len) {
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
        uVar1 = prVar6->cnt;
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
        printf("Root is null, but the size of the vector (excluding its tail) is %u.\n",
               (ulong)(uVar1 - prVar6->tail_len));
        return false;
      }
    }
    else {
      prVar8 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
      uVar1 = prVar8->cnt;
      prVar8 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
      uVar2 = prVar8->tail_len;
      prVar8 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
      bVar5 = rrb_details::validate_subtree<char,false,5>(&prVar6->root,uVar1 - uVar2,prVar8->shift)
      ;
      if (!bVar5) goto LAB_00143af1;
    }
    bVar5 = true;
  }
  else {
LAB_00143af1:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool validate_rrb(const ref<rrb<T, atomic_ref_counting, N>>& rrb)
    {
    using namespace rrb_details;
    // ensure the rrb tree is consistent      
    // the rrb tree should always have a tail
    if (rrb->tail->len != rrb->tail_len)
      {
      printf("The tail of this rrb-tree says it is of length %u, but the rrb head claims it\nis %u elements long.", rrb->tail->len, rrb->tail_len);
      return false;
      }
    else
      {
      ref<tree_node<T, atomic_ref_counting>> tail = rrb->tail;
      if (!validate_subtree<T, atomic_ref_counting, N>(tail, rrb->tail_len, 0))
        return false;
      }
    if (rrb->root.ptr == nullptr)
      {
      if (rrb->cnt - rrb->tail_len != 0)
        {
        printf("Root is null, but the size of the vector (excluding its tail) is %u.\n", rrb->cnt - rrb->tail_len);
        return false;
        }
      }
    else
      {
      if (!validate_subtree<T, atomic_ref_counting, N>(rrb->root, rrb->cnt - rrb->tail_len, rrb->shift))
        return false;
      }
    return true;
    }